

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86formatter.cpp
# Opt level: O2

Error asmjit::v1_14::x86::FormatterInternal::formatFeature(String *sb,uint32_t featureId)

{
  Error EVar1;
  ulong uVar2;
  
  uVar2 = 0x91;
  if (featureId < 0x91) {
    uVar2 = (ulong)featureId;
  }
  EVar1 = String::_opString(sb,kAppend,"None" + formatFeature::sFeatureIndex[uVar2],
                            0xffffffffffffffff);
  return EVar1;
}

Assistant:

Error FormatterInternal::formatFeature(String& sb, uint32_t featureId) noexcept {
  // @EnumStringBegin{"enum": "CpuFeatures::X86", "output": "sFeature", "strip": "k"}@
  static const char sFeatureString[] =
    "None\0"
    "MT\0"
    "NX\0"
    "3DNOW\0"
    "3DNOW2\0"
    "ADX\0"
    "AESNI\0"
    "ALTMOVCR8\0"
    "AMX_BF16\0"
    "AMX_COMPLEX\0"
    "AMX_FP16\0"
    "AMX_INT8\0"
    "AMX_TILE\0"
    "APX_F\0"
    "AVX\0"
    "AVX2\0"
    "AVX512_4FMAPS\0"
    "AVX512_4VNNIW\0"
    "AVX512_BF16\0"
    "AVX512_BITALG\0"
    "AVX512_BW\0"
    "AVX512_CD\0"
    "AVX512_DQ\0"
    "AVX512_ER\0"
    "AVX512_F\0"
    "AVX512_FP16\0"
    "AVX512_IFMA\0"
    "AVX512_PF\0"
    "AVX512_VBMI\0"
    "AVX512_VBMI2\0"
    "AVX512_VL\0"
    "AVX512_VNNI\0"
    "AVX512_VP2INTERSECT\0"
    "AVX512_VPOPCNTDQ\0"
    "AVX_IFMA\0"
    "AVX_NE_CONVERT\0"
    "AVX_VNNI\0"
    "AVX_VNNI_INT16\0"
    "AVX_VNNI_INT8\0"
    "BMI\0"
    "BMI2\0"
    "CET_IBT\0"
    "CET_SS\0"
    "CET_SSS\0"
    "CLDEMOTE\0"
    "CLFLUSH\0"
    "CLFLUSHOPT\0"
    "CLWB\0"
    "CLZERO\0"
    "CMOV\0"
    "CMPCCXADD\0"
    "CMPXCHG16B\0"
    "CMPXCHG8B\0"
    "ENCLV\0"
    "ENQCMD\0"
    "ERMS\0"
    "F16C\0"
    "FMA\0"
    "FMA4\0"
    "FPU\0"
    "FSGSBASE\0"
    "FSRM\0"
    "FSRC\0"
    "FSRS\0"
    "FXSR\0"
    "FXSROPT\0"
    "FZRM\0"
    "GEODE\0"
    "GFNI\0"
    "HLE\0"
    "HRESET\0"
    "I486\0"
    "INVLPGB\0"
    "LAHFSAHF\0"
    "LAM\0"
    "LWP\0"
    "LZCNT\0"
    "MCOMMIT\0"
    "MMX\0"
    "MMX2\0"
    "MONITOR\0"
    "MONITORX\0"
    "MOVBE\0"
    "MOVDIR64B\0"
    "MOVDIRI\0"
    "MPX\0"
    "MSR\0"
    "MSRLIST\0"
    "MSSE\0"
    "OSXSAVE\0"
    "OSPKE\0"
    "PCLMULQDQ\0"
    "PCONFIG\0"
    "POPCNT\0"
    "PREFETCHI\0"
    "PREFETCHW\0"
    "PREFETCHWT1\0"
    "PTWRITE\0"
    "RAO_INT\0"
    "RMPQUERY\0"
    "RDPID\0"
    "RDPRU\0"
    "RDRAND\0"
    "RDSEED\0"
    "RDTSC\0"
    "RDTSCP\0"
    "RTM\0"
    "SEAM\0"
    "SERIALIZE\0"
    "SEV\0"
    "SEV_ES\0"
    "SEV_SNP\0"
    "SHA\0"
    "SHA512\0"
    "SKINIT\0"
    "SM3\0"
    "SM4\0"
    "SMAP\0"
    "SME\0"
    "SMEP\0"
    "SMX\0"
    "SSE\0"
    "SSE2\0"
    "SSE3\0"
    "SSE4_1\0"
    "SSE4_2\0"
    "SSE4A\0"
    "SSSE3\0"
    "SVM\0"
    "TBM\0"
    "TSE\0"
    "TSX\0"
    "TSXLDTRK\0"
    "UINTR\0"
    "VAES\0"
    "VMX\0"
    "VPCLMULQDQ\0"
    "WAITPKG\0"
    "WBNOINVD\0"
    "WRMSRNS\0"
    "XOP\0"
    "XSAVE\0"
    "XSAVEC\0"
    "XSAVEOPT\0"
    "XSAVES\0"
    "<Unknown>\0";

  static const uint16_t sFeatureIndex[] = {
    0, 5, 8, 11, 17, 24, 28, 34, 44, 53, 65, 74, 83, 92, 98, 102, 107, 121, 135,
    147, 161, 171, 181, 191, 201, 210, 222, 234, 244, 256, 269, 279, 291, 311,
    328, 337, 352, 361, 376, 390, 394, 399, 407, 414, 422, 431, 439, 450, 455,
    462, 467, 477, 488, 498, 504, 511, 516, 521, 525, 530, 534, 543, 548, 553,
    558, 563, 571, 576, 582, 587, 591, 598, 603, 611, 620, 624, 628, 634, 642,
    646, 651, 659, 668, 674, 684, 692, 696, 700, 708, 713, 721, 727, 737, 745,
    752, 762, 772, 784, 792, 800, 809, 815, 821, 828, 835, 841, 848, 852, 857,
    867, 871, 878, 886, 890, 897, 904, 908, 912, 917, 921, 926, 930, 934, 939,
    944, 951, 958, 964, 970, 974, 978, 982, 986, 995, 1001, 1006, 1010, 1021,
    1029, 1038, 1046, 1050, 1056, 1063, 1072, 1079
  };
  // @EnumStringEnd@

  return sb.append(sFeatureString + sFeatureIndex[Support::min<uint32_t>(featureId, uint32_t(CpuFeatures::X86::kMaxValue) + 1)]);
}